

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oonf_packet_socket.c
# Opt level: O3

int oonf_packet_send(oonf_packet_socket *pktsocket,netaddr_socket *remote,void *data,size_t length)

{
  uint32_t *puVar1;
  autobuf *autobuf;
  ssize_t sVar2;
  char *pcVar3;
  uint *puVar4;
  uint64_t uVar5;
  ulong uVar6;
  char *pcVar7;
  uint64_t uVar8;
  char *pcVar9;
  int __flags;
  int iVar10;
  oonf_log_source oVar11;
  uint uVar12;
  char *format;
  netaddr_str buf;
  
  if ((pktsocket->out)._len != 0) {
LAB_00119e0a:
    autobuf = &pktsocket->out;
    abuf_memcpy(autobuf,remote,0x80);
    buf.buf._0_2_ = SUB82(length,0);
    abuf_memcpy(autobuf,&buf,2);
    abuf_memcpy(autobuf,data,length);
    oonf_socket_set_write(&pktsocket->scheduler_entry,true);
    return 0;
  }
  __flags = (uint)(pktsocket->config).dont_route << 2;
  iVar10 = (pktsocket->scheduler_entry).fd.fd;
  if (remote == (netaddr_socket *)0x0) {
    sVar2 = send(iVar10,data,length,__flags);
  }
  else {
    sVar2 = sendto(iVar10,data,length,__flags,(sockaddr *)&remote->v4,0x80);
  }
  oVar11 = _oonf_packet_socket_subsystem.logging;
  if (0 < (int)sVar2) {
    if ((log_global_mask[_oonf_packet_socket_subsystem.logging] & 1) != 0) {
      pcVar3 = netaddr_socket_to_string(&buf,remote);
      pcVar7 = "";
      if (pktsocket->os_if != (os_interface *)0x0) {
        pcVar7 = pktsocket->os_if->name;
      }
      oonf_log(LOG_SEVERITY_DEBUG,oVar11,"src/base/oonf_packet_socket.c",0xe6,(void *)0x0,0,
               "Sent %d bytes to %s %s",sVar2,pcVar3,pcVar7);
    }
    puVar1 = &(pktsocket->scheduler_entry)._stat_send;
    *puVar1 = *puVar1 + 1;
    return 0;
  }
  puVar4 = (uint *)__errno_location();
  oVar11 = _oonf_packet_socket_subsystem.logging;
  uVar12 = *puVar4;
  if ((uVar12 == 0xb) || (uVar12 == 4)) goto LAB_00119e0a;
  if (uVar12 != 1) {
    if ((log_global_mask[_oonf_packet_socket_subsystem.logging] & 4) != 0) {
      pcVar7 = netaddr_socket_to_string(&buf,remote);
      pcVar3 = strerror(*puVar4);
      oonf_log(LOG_SEVERITY_WARN,oVar11,"src/base/oonf_packet_socket.c",0xf1,(void *)0x0,0,
               "Cannot send UDP packet to %s: %s (%d)",pcVar7,pcVar3,(ulong)*puVar4);
      return -1;
    }
    return -1;
  }
  uVar8 = pktsocket->_errno1_measurement_time;
  uVar5 = oonf_clock_getNow();
  uVar12 = pktsocket->_errno1_count;
  if ((long)(uVar8 - uVar5) < -59999) {
    uVar6 = SUB168(ZEXT416(uVar12) /
                   (ZEXT816(0) * ZEXT816(0x45e7b272f608771) >> 0x45 &
                   (undefined1  [16])0x7ffffffffffffff),0);
    pktsocket->_errno1_count = uVar12 + 1;
    if ((pktsocket->_errno1_suppression == true) && (uVar6 < 5)) {
      pktsocket->_errno1_suppression = false;
    }
    else if ((pktsocket->_errno1_suppression == false) && (10 < uVar6)) goto LAB_0011a091;
LAB_0011a09c:
    uVar8 = oonf_clock_getNow();
    pktsocket->_errno1_measurement_time = uVar8;
    pktsocket->_errno1_count = 1;
    pcVar7 = "-";
    if (pktsocket->os_if != (os_interface *)0x0) {
      pcVar7 = pktsocket->os_if->name;
    }
    if ((pktsocket->_errno1_suppression & uVar12 != 0) != 0) {
LAB_0011a0db:
      oVar11 = _oonf_packet_socket_subsystem.logging;
      if ((log_global_mask[_oonf_packet_socket_subsystem.logging] & 4) == 0) {
        return -1;
      }
      pcVar3 = netaddr_socket_to_string(&buf,remote);
      pcVar9 = strerror(*puVar4);
      uVar12 = *puVar4;
      format = "Cannot send UDP packet to %s (%s): %s (%d) (%d similar errors suppressed)";
      iVar10 = 0x1fb;
      goto LAB_0011a193;
    }
  }
  else {
    pktsocket->_errno1_count = uVar12 + 1;
    if (10 < uVar12 && (pktsocket->_errno1_suppression & 1U) == 0) {
LAB_0011a091:
      pktsocket->_errno1_suppression = true;
      uVar12 = 0;
      goto LAB_0011a09c;
    }
    pcVar7 = "-";
    if (pktsocket->os_if != (os_interface *)0x0) {
      pcVar7 = pktsocket->os_if->name;
    }
    if ((pktsocket->_errno1_suppression & uVar12 != 0) != 0) {
      if (1 < uVar12 + 1) {
        return -1;
      }
      goto LAB_0011a0db;
    }
  }
  oVar11 = _oonf_packet_socket_subsystem.logging;
  if ((log_global_mask[_oonf_packet_socket_subsystem.logging] & 4) == 0) {
    return -1;
  }
  pcVar3 = netaddr_socket_to_string(&buf,remote);
  pcVar9 = strerror(*puVar4);
  uVar12 = *puVar4;
  format = "Cannot send UDP packet to %s (%s): %s (%d)";
  iVar10 = 0x1ff;
LAB_0011a193:
  oonf_log(LOG_SEVERITY_WARN,oVar11,"src/base/oonf_packet_socket.c",iVar10,(void *)0x0,0,format,
           pcVar3,pcVar7,pcVar9,(ulong)uVar12);
  return -1;
}

Assistant:

int
oonf_packet_send(struct oonf_packet_socket *pktsocket, union netaddr_socket *remote, const void *data, size_t length) {
  int result;
  struct netaddr_str buf;

  if (abuf_getlen(&pktsocket->out) == 0) {
    /* no backlog of outgoing packets, try to send directly */
    result = os_fd_sendto(&pktsocket->scheduler_entry.fd, data, length, remote, pktsocket->config.dont_route);
    if (result > 0) {
      /* successful */
      OONF_DEBUG(LOG_PACKET, "Sent %d bytes to %s %s", result, netaddr_socket_to_string(&buf, remote),
        pktsocket->os_if != NULL ? pktsocket->os_if->name : "");
      oonf_socket_register_direct_send(&pktsocket->scheduler_entry);
      return 0;
    }

    if (errno == EPERM) {
      _handle_errno1(pktsocket, remote);
      return -1;
    }
    if (errno != EINTR && errno != EAGAIN && errno != EWOULDBLOCK) {
      OONF_WARN(LOG_PACKET, "Cannot send UDP packet to %s: %s (%d)", netaddr_socket_to_string(&buf, remote),
        strerror(errno), errno);
      return -1;
    }
  }

  /* append destination */
  abuf_memcpy(&pktsocket->out, remote, sizeof(*remote));

  /* append data length */
  abuf_append_uint16(&pktsocket->out, length);

  /* append data */
  abuf_memcpy(&pktsocket->out, data, length);

  /* activate outgoing socket scheduler */
  oonf_socket_set_write(&pktsocket->scheduler_entry, true);
  return 0;
}